

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O1

floatx80 propagateFloatx80NaN_riscv64(floatx80 a,floatx80 b,float_status *status)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  floatx80 fVar10;
  
  uVar3 = b._8_4_;
  uVar4 = b.low;
  uVar6 = a.low;
  uVar5 = a._8_4_;
  bVar8 = 2;
  bVar9 = 2;
  if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      (~uVar5 & 0x7fff) == 0) {
    bVar9 = (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0
            || ((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0
            ) ^ 5;
  }
  if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
      (~uVar3 & 0x7fff) == 0) {
    bVar8 = (((undefined1  [16])b & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0
            || ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0
            ) ^ 5;
  }
  if ((bVar9 == 5) || (bVar8 == 5)) {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  if (status->default_nan_mode != '\0') {
    uVar2 = 0xc000000000000000;
    uVar3 = (uint)CONCAT62(b._10_6_,0xffff);
    goto LAB_00c47ab1;
  }
  bVar7 = true;
  if (uVar4 <= uVar6) {
    bVar7 = b.high <= a.high && uVar6 <= uVar4;
  }
  if (bVar9 == 4) {
    if (bVar8 != 5) {
      bVar1 = (bool)(bVar8 == 4 & bVar7);
      goto LAB_00c47a92;
    }
LAB_00c47aa4:
    uVar2 = uVar6 | 0xc000000000000000;
    uVar3 = uVar5;
    if (bVar9 != 5) {
      uVar2 = uVar6;
    }
  }
  else {
    if (bVar9 == 5) {
      bVar1 = bVar8 == 4;
      if (bVar8 == 5) {
        bVar1 = bVar7;
      }
LAB_00c47a92:
      if (!bVar1) goto LAB_00c47aa4;
    }
    uVar2 = uVar4 | 0xc000000000000000;
    if (bVar8 != 5) {
      uVar2 = uVar4;
    }
  }
LAB_00c47ab1:
  fVar10._8_4_ = uVar3;
  fVar10.low = uVar2;
  fVar10._12_4_ = 0;
  return fVar10;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}